

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O0

void mod2dense_print(FILE *f,mod2dense *m)

{
  uint uVar1;
  int *in_RSI;
  FILE *in_RDI;
  int j;
  int i;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  FILE *__stream;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < *in_RSI; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_RSI[1]; local_18 = local_18 + 1) {
      __stream = in_RDI;
      uVar1 = mod2dense_get((mod2dense *)in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
      ;
      fprintf(__stream," %d",(ulong)uVar1);
    }
    fprintf(in_RDI,"\n");
  }
  return;
}

Assistant:

void mod2dense_print     
( FILE *f,
  mod2dense *m
)
{ 
  int i, j;

  for (i = 0; i<mod2dense_rows(m); i++)
  { for (j = 0; j<mod2dense_cols(m); j++)
    { fprintf(f," %d",mod2dense_get(m,i,j));
    }
    fprintf(f,"\n");
  }
}